

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateSurfaceTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_5::CreatePixmapSurfaceCase::executeForConfig
          (CreatePixmapSurfaceCase *this,EGLDisplay display,EGLConfig config)

{
  NativePixmapFactory *pNVar1;
  TestLog *pTVar2;
  Library *config_00;
  EGLConfig pvVar3;
  Capability CVar4;
  deUint32 dVar5;
  deBool dVar6;
  NativeDisplayFactory *factory;
  CommandLine *cmdLine;
  NotSupportedError *pNVar7;
  MessageBuilder *pMVar8;
  NativeDisplay *pNVar9;
  undefined8 uVar10;
  NativePixmap *pixmap_00;
  EGLSurface pvVar11;
  MessageBuilder local_510;
  MessageBuilder local_390;
  int local_210;
  int local_20c;
  EGLint pixmapHeight;
  EGLint pixmapWidth;
  UniqueSurface surface;
  undefined1 local_1e8 [8];
  UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> pixmap;
  int height;
  int width;
  NativePixmapFactory *local_40;
  NativePixmapFactory *pixmapFactory;
  TestLog *pTStack_30;
  EGLint id;
  TestLog *log;
  Library *egl;
  EGLConfig config_local;
  EGLDisplay display_local;
  CreatePixmapSurfaceCase *this_local;
  
  egl = (Library *)config;
  config_local = display;
  display_local = this;
  log = (TestLog *)
        EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pTStack_30 = tcu::TestContext::getLog
                         ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
  pixmapFactory._4_4_ = eglu::getConfigID((Library *)log,config_local,egl);
  factory = EglTestContext::getNativeDisplayFactory
                      ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  cmdLine = tcu::TestContext::getCommandLine
                      ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  local_40 = eglu::selectNativePixmapFactory(factory,cmdLine);
  if ((this->m_useLegacyCreate & 1U) == 0) {
    CVar4 = eglu::NativePixmapFactory::getCapabilities(local_40);
    if ((CVar4 & CAPABILITY_CREATE_SURFACE_PLATFORM) == 0) {
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar7,"Native pixmap doesn\'t support eglCreatePlatformPixmapSurfaceEXT()",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                 ,0xbf);
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  else {
    CVar4 = eglu::NativePixmapFactory::getCapabilities(local_40);
    if ((CVar4 & CAPABILITY_CREATE_SURFACE_LEGACY) == 0) {
      pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar7,"Native pixmap doesn\'t support legacy eglCreatePixmapSurface()",(char *)0x0
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                 ,0xba);
      __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  tcu::TestLog::operator<<
            ((MessageBuilder *)&height,pTStack_30,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&height,
                      (char (*) [40])"Creating pixmap surface with config ID ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)((long)&pixmapFactory + 4));
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&height);
  dVar5 = (*(code *)log->m_log[6].lock)();
  eglu::checkError(dVar5,"init",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                   ,0xc3);
  pNVar1 = local_40;
  pixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.m_data._12_4_
       = 0x40;
  pixmap.super_UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>.m_data._8_4_
       = 0x40;
  pNVar9 = EglTestContext::getNativeDisplay
                     ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  uVar10 = (**(code **)(*(long *)pNVar1 + 0x20))(pNVar1,pNVar9,config_local,egl,0,0x40,0x40);
  de::DefaultDeleter<eglu::NativePixmap>::DefaultDeleter
            ((DefaultDeleter<eglu::NativePixmap> *)((long)&surface.m_surface + 7));
  de::details::UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::UniquePtr
            ((UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)local_1e8,
             uVar10);
  pvVar3 = config_local;
  config_00 = egl;
  pTVar2 = log;
  pNVar9 = EglTestContext::getNativeDisplay
                     ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pixmap_00 = de::details::UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::
              operator*((UniqueBase<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)
                        local_1e8);
  pvVar11 = createPixmapSurface(pvVar3,config_00,pNVar9,pixmap_00,
                                (bool)(this->m_useLegacyCreate & 1));
  eglu::UniqueSurface::UniqueSurface
            ((UniqueSurface *)&pixmapHeight,(Library *)pTVar2,pvVar3,pvVar11);
  local_20c = 0;
  local_210 = 0;
  do {
    pvVar3 = config_local;
    pTVar2 = log;
    pvVar11 = eglu::UniqueSurface::operator*((UniqueSurface *)&pixmapHeight);
    (*(code *)pTVar2->m_log[8].writer)(pTVar2,pvVar3,pvVar11,0x3057,&local_20c);
    dVar5 = (*(code *)log->m_log[6].lock)();
    eglu::checkError(dVar5,"querySurface(display, *surface, EGL_WIDTH, &pixmapWidth)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                     ,0xcd);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    pvVar3 = config_local;
    pTVar2 = log;
    pvVar11 = eglu::UniqueSurface::operator*((UniqueSurface *)&pixmapHeight);
    (*(code *)pTVar2->m_log[8].writer)(pTVar2,pvVar3,pvVar11,0x3056,&local_210);
    dVar5 = (*(code *)log->m_log[6].lock)();
    eglu::checkError(dVar5,"querySurface(display, *surface, EGL_HEIGHT, &pixmapHeight)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                     ,0xce);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  if ((local_20c < 1) || (local_210 < 1)) {
    tcu::TestLog::operator<<(&local_390,pTStack_30,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_390,(char (*) [30])0x2b59a9f);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_20c);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a9098a);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_210);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_390);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid surface size");
  }
  else {
    tcu::TestLog::operator<<(&local_510,pTStack_30,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_510,(char (*) [7])"  Pass");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_510);
  }
  eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&pixmapHeight);
  de::details::UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_>::~UniquePtr
            ((UniquePtr<eglu::NativePixmap,_de::DefaultDeleter<eglu::NativePixmap>_> *)local_1e8);
  return;
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&						egl				= m_eglTestCtx.getLibrary();
		TestLog&							log				= m_testCtx.getLog();
		EGLint								id				= eglu::getConfigID(egl, display, config);
		const eglu::NativePixmapFactory&	pixmapFactory	= eglu::selectNativePixmapFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		// \todo [2011-03-23 pyry] Iterate thru all possible combinations of EGL_RENDER_BUFFER, EGL_VG_COLORSPACE and EGL_VG_ALPHA_FORMAT

		if (m_useLegacyCreate)
		{
			if ((pixmapFactory.getCapabilities() & eglu::NativePixmap::CAPABILITY_CREATE_SURFACE_LEGACY) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support legacy eglCreatePixmapSurface()");
		}
		else
		{
			if ((pixmapFactory.getCapabilities() & eglu::NativePixmap::CAPABILITY_CREATE_SURFACE_PLATFORM) == 0)
				TCU_THROW(NotSupportedError, "Native pixmap doesn't support eglCreatePlatformPixmapSurfaceEXT()");
		}

		log << TestLog::Message << "Creating pixmap surface with config ID " << id << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "init");

		{
			const int							width			= 64;
			const int							height			= 64;
			de::UniquePtr<eglu::NativePixmap>	pixmap			(pixmapFactory.createPixmap(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, width, height));
			eglu::UniqueSurface					surface			(egl, display, createPixmapSurface(display, config, m_eglTestCtx.getNativeDisplay(), *pixmap, m_useLegacyCreate));
			EGLint								pixmapWidth		= 0;
			EGLint								pixmapHeight	= 0;

			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_WIDTH,		&pixmapWidth));
			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_HEIGHT,	&pixmapHeight));

			if (pixmapWidth <= 0 || pixmapHeight <= 0)
			{
				log << TestLog::Message << "  Fail, invalid surface size " << pixmapWidth << "x" << pixmapHeight << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid surface size");
			}
			else
				log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
	}